

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O0

uint32_t __thiscall
ICACHE::ic_simulate_fetch(ICACHE *this,oraddr_t fetchaddr,oraddr_t virt_addr,int insn_ci)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  BUS_DEVICE *pBVar5;
  uint uVar6;
  BUS_DEVICE *device_1;
  BUS_DEVICE *device;
  uint minlru;
  oraddr_t reload_end;
  oraddr_t reload_addr;
  uint32_t tmp;
  oraddr_t tagaddr;
  oraddr_t lru_way;
  oraddr_t way;
  oraddr_t set;
  int insn_ci_local;
  oraddr_t virt_addr_local;
  oraddr_t fetchaddr_local;
  ICACHE *this_local;
  
  if ((((((this->super_CACHE).cpu)->sprs[1] & 4) == 0) ||
      ((((this->super_CACHE).cpu)->sprs[0x11] & 0x10) == 0)) || (insn_ci != 0)) {
    pBVar5 = BUS::get_device((this->super_CACHE).bus_p,fetchaddr);
    this_local._4_4_ = (*pBVar5->_vptr_BUS_DEVICE[2])(pBVar5,(ulong)fetchaddr,(ulong)virt_addr);
  }
  else {
    uVar3 = fetchaddr & (this->super_CACHE).tagaddr_mask;
    uVar2 = (fetchaddr & (this->super_CACHE).set_mask) >>
            ((byte)(this->super_CACHE).blocksize_log2 & 0x1f);
    for (tagaddr = uVar2; tmp = uVar2, tagaddr < (this->super_CACHE).last_way;
        tagaddr = (this->super_CACHE).nsets + tagaddr) {
      if ((this->super_CACHE).tags[tagaddr] == uVar3) {
        for (; tmp < (this->super_CACHE).last_way; tmp = (this->super_CACHE).nsets + tmp) {
          if ((this->super_CACHE).lrus[tagaddr] < (this->super_CACHE).lrus[tmp]) {
            puVar1 = (this->super_CACHE).lrus;
            puVar1[tmp] = puVar1[tmp] - 1;
          }
        }
        (this->super_CACHE).lrus[tagaddr] = (this->super_CACHE).ustates_reload;
        return *(uint32_t *)
                ((this->super_CACHE).mem +
                (tagaddr << ((byte)(this->super_CACHE).blocksize_log2 & 0x1f) |
                fetchaddr & (this->super_CACHE).block_offset_mask));
      }
    }
    device._4_4_ = (this->super_CACHE).ustates_reload;
    tagaddr = uVar2;
    for (; tmp < (this->super_CACHE).last_way; tmp = (this->super_CACHE).nsets + tmp) {
      if ((this->super_CACHE).lrus[tmp] < device._4_4_) {
        tagaddr = tmp;
        device._4_4_ = (this->super_CACHE).lrus[tmp];
      }
    }
    (this->super_CACHE).tags[tagaddr] = uVar3;
    for (tmp = uVar2; tmp < (this->super_CACHE).last_way; tmp = (this->super_CACHE).nsets + tmp) {
      if ((this->super_CACHE).lrus[tmp] != 0) {
        puVar1 = (this->super_CACHE).lrus;
        puVar1[tmp] = puVar1[tmp] - 1;
      }
    }
    (this->super_CACHE).lrus[tagaddr] = (this->super_CACHE).ustates_reload;
    minlru = fetchaddr & (this->super_CACHE).block_offset_mask;
    uVar3 = minlru + (this->super_CACHE).blocksize;
    uVar6 = (this->super_CACHE).block_mask & fetchaddr;
    uVar2 = tagaddr << ((byte)(this->super_CACHE).blocksize_log2 & 0x1f);
    for (; minlru < uVar3; minlru = minlru + 4) {
      pBVar5 = BUS::get_device((this->super_CACHE).bus_p,
                               uVar6 | minlru & (this->super_CACHE).block_offset_mask);
      iVar4 = (*pBVar5->_vptr_BUS_DEVICE[2])
                        (pBVar5,(ulong)(uVar6 | minlru & (this->super_CACHE).block_offset_mask),0);
      *(int *)((this->super_CACHE).mem + (uVar2 | minlru & (this->super_CACHE).block_offset_mask)) =
           iVar4;
    }
    this_local._4_4_ =
         *(uint32_t *)
          ((this->super_CACHE).mem + (uVar2 | minlru & (this->super_CACHE).block_offset_mask));
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ICACHE::ic_simulate_fetch(oraddr_t fetchaddr, oraddr_t virt_addr, int insn_ci)
{
    oraddr_t set;
    oraddr_t way;
    oraddr_t lru_way;
    oraddr_t tagaddr;
    uint32_t tmp;
    oraddr_t reload_addr;
    oraddr_t reload_end;
    unsigned int minlru;

    /* ICache simulation enabled/disabled. */
    if (!(cpu->sprs[SPR_UPR] & SPR_UPR_ICP) ||
        !(cpu->sprs[SPR_SR] & SPR_SR_ICE) || insn_ci)
    {
        BUS_DEVICE * device = bus_p->get_device(fetchaddr);
        tmp = device->Read32(fetchaddr, virt_addr);
        // if (cur_area && cur_area->log)
        //     fprintf(cur_area->log, "[%" PRIxADDR "] -> read %08" PRIx32 "\n",
        //             fetchaddr, tmp);
        return tmp;
    }

    /* Which set to check out? */
    set = (fetchaddr & set_mask) >> blocksize_log2;
    tagaddr = fetchaddr & tagaddr_mask;

    /* Scan all ways and try to find a matching way. */
    for (way = set; way < last_way; way += nsets)
    {
        if (tags[way] == tagaddr)
        {
            // ic_stats.readhit++;

            for (lru_way = set; lru_way < last_way; lru_way += nsets)
                if (lrus[lru_way] > lrus[way])
                    lrus[lru_way]--;
            lrus[way] = ustates_reload;
            // runtime.sim.mem_cycles += ic->hitdelay;
            way <<= blocksize_log2;
            return *(uint32_t *)&mem[way | (fetchaddr & block_offset_mask)];
        }
    }

    minlru = ustates_reload;
    way = set;

    // ic_stats.readmiss++;

    for (lru_way = set; lru_way < last_way; lru_way += nsets)
    {
        if (lrus[lru_way] < minlru)
        {
            way = lru_way;
            minlru = lrus[lru_way];
        }
    }

    tags[way] = tagaddr;
    for (lru_way = set; lru_way < last_way; lru_way += nsets)
        if (lrus[lru_way])
            lrus[lru_way]--;
    lrus[way] = ustates_reload;

    reload_addr = fetchaddr & block_offset_mask;
    reload_end = reload_addr + blocksize;

    fetchaddr &= block_mask;

    way <<= blocksize_log2;
    for (; reload_addr < reload_end; reload_addr += 4)
    {
        BUS_DEVICE * device = bus_p->get_device(fetchaddr | (reload_addr & block_offset_mask));
        tmp = *(uint32_t *)&mem[way | (reload_addr & block_offset_mask)]
            = device->Read32(fetchaddr | (reload_addr & block_offset_mask), 0);

        // if (!cur_area)
        // {
        //     tags[way >> blocksize_log2] = -1;
        //     lrus[way >> blocksize_log2] = 0;
        //     return 0;
        // }
        // else if (cur_area->log)
        //     fprintf(cur_area->log, "[%" PRIxADDR "] -> read %08" PRIx32 "\n",
        //             fetchaddr, tmp);
    }

    // runtime.sim.mem_cycles += missdelay;

    // if (config.pcu.enabled)
    //     pcu_count_event(SPR_PCMR_ICM);

    return *(uint32_t *)&mem[way | (reload_addr & block_offset_mask)];
}